

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_test.cc
# Opt level: O2

void __thiscall leveldb::log::_Test_BadRecordType::_Run(_Test_BadRecordType *this)

{
  char *pcVar1;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  Tester local_1b8;
  
  std::__cxx11::string::string((string *)&local_1b8,"foo",(allocator *)&local_1f8);
  LogTest::Write(&this->super_LogTest,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  pcVar1 = (this->super_LogTest).dest_.contents_._M_dataplus._M_p + 6;
  *pcVar1 = *pcVar1 + 'd';
  LogTest::FixChecksum(&this->super_LogTest,0,3);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x17b);
  LogTest::Read_abi_cxx11_(&local_1f8,&this->super_LogTest);
  test::Tester::IsEq<char[4],std::__cxx11::string>(&local_1b8,(char (*) [4])"EOF",&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x17c);
  local_1d8._M_dataplus._M_p._0_4_ = 3;
  local_1f8._M_dataplus._M_p = (pointer)(this->super_LogTest).report_.dropped_bytes_;
  test::Tester::IsEq<int,unsigned_long>(&local_1b8,(int *)&local_1d8,(unsigned_long *)&local_1f8);
  test::Tester::~Tester(&local_1b8);
  test::Tester::Tester
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/log_test.cc"
             ,0x17d);
  std::__cxx11::string::string((string *)&local_1d8,"unknown record type",&local_1f9);
  LogTest::MatchError(&local_1f8,&this->super_LogTest,&local_1d8);
  test::Tester::IsEq<char[3],std::__cxx11::string>(&local_1b8,(char (*) [3])"OK",&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_1d8);
  test::Tester::~Tester(&local_1b8);
  return;
}

Assistant:

TEST(LogTest, BadRecordType) {
  Write("foo");
  // Type is stored in header[6]
  IncrementByte(6, 100);
  FixChecksum(0, 3);
  ASSERT_EQ("EOF", Read());
  ASSERT_EQ(3, DroppedBytes());
  ASSERT_EQ("OK", MatchError("unknown record type"));
}